

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall ON_SubDMeshFragmentIterator::IsEmpty(ON_SubDMeshFragmentIterator *this)

{
  ON_SubDFace *local_58;
  ON_SubDFace *f;
  ON_SubDFaceIterator local_fit;
  ON_SubDMeshFragment *f0;
  ON_SubDMeshFragmentIterator *this_local;
  
  local_fit.m_component_ptr.m_ptr = 0;
  if ((this->m_bFromFaceFragments & 1U) == 0) {
    local_fit.m_component_ptr.m_ptr = (ON__UINT_PTR)ON_SubDMesh::FirstFragment(&this->m_limit_mesh);
  }
  else {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&f,&this->m_fit);
    local_58 = ON_SubDFaceIterator::FirstFace((ON_SubDFaceIterator *)&f);
    while ((local_58 != (ON_SubDFace *)0x0 &&
           (local_fit.m_component_ptr.m_ptr = (ON__UINT_PTR)ON_SubDFace::MeshFragments(local_58),
           (ON_SubDMeshFragment *)local_fit.m_component_ptr.m_ptr == (ON_SubDMeshFragment *)0x0))) {
      local_58 = ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&f);
    }
    ON_SubDFaceIterator::~ON_SubDFaceIterator((ON_SubDFaceIterator *)&f);
  }
  return local_fit.m_component_ptr.m_ptr == 0;
}

Assistant:

bool ON_SubDMeshFragmentIterator::IsEmpty() const
{
  const ON_SubDMeshFragment* f0 = nullptr;
  if (m_bFromFaceFragments)
  {
    ON_SubDFaceIterator local_fit(m_fit); // cannot modify fit
    for (const ON_SubDFace* f = local_fit.FirstFace(); nullptr != f; f = local_fit.NextFace())
    {
      f0 = f->MeshFragments();
      if (nullptr != f0)
        break;
    }
  }
  else
  {
    f0 = m_limit_mesh.FirstFragment();
  }
  return (nullptr == f0);
}